

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O1

float Abc_ObjDelay0(Abc_IffMan_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  Abc_Obj_t *ppNodes [6];
  Abc_Obj_t *local_48 [7];
  
  Abc_ObjSortByDelay(p,pObj,1,local_48);
  lVar2 = (long)(pObj->vFanins).nSize;
  fVar4 = 0.0;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      iVar1 = local_48[lVar3]->Id;
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIfif.c"
                      ,0x33,"Abc_IffObj_t *Abc_IffObj(Abc_IffMan_t *, int)");
      }
      fVar5 = p->pObjs[iVar1].Delay[1] + p->pPars->pLutDelays[lVar3];
      if (fVar4 <= fVar5) {
        fVar4 = fVar5;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return fVar4;
}

Assistant:

float Abc_ObjDelay0( Abc_IffMan_t * p, Abc_Obj_t * pObj )
{
    int i;
    float Delay0 = 0;
    Abc_Obj_t * ppNodes[6];
    Abc_ObjSortByDelay( p, pObj, 1, ppNodes );
    for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
        Delay0 = Abc_MaxFloat( Delay0, Abc_IffDelay(p, ppNodes[i], 1) + p->pPars->pLutDelays[i] );
    return Delay0;
}